

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-private.h
# Opt level: O0

double __thiscall Dashel::ParameterSet::get<double>(ParameterSet *this,char *key)

{
  bool bVar1;
  string *psVar2;
  DashelException *this_00;
  char *reason;
  pointer ppVar3;
  istream *this_01;
  istringstream local_230 [8];
  istringstream iss;
  allocator<char> local_a9;
  string local_a8 [32];
  string local_88 [8];
  string r;
  allocator<char> local_49;
  key_type local_48;
  _Self local_28;
  const_iterator it;
  double t;
  char *key_local;
  ParameterSet *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,key,&local_49);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->values,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  r.field_2._8_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->values);
  bVar1 = std::operator==(&local_28,(_Self *)((long)&r.field_2 + 8));
  if (!bVar1) {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_28);
    std::__cxx11::istringstream::istringstream(local_230,&ppVar3->second,8);
    this_01 = (istream *)std::istream::operator>>((istream *)local_230,std::boolalpha);
    std::istream::operator>>(this_01,(double *)&it);
    std::__cxx11::istringstream::~istringstream(local_230);
    return (double)it._M_node;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a8,"Parameter missing: ",&local_a9);
  psVar2 = (string *)std::__cxx11::string::append((char *)local_a8);
  std::__cxx11::string::string(local_88,psVar2);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator(&local_a9);
  this_00 = (DashelException *)__cxa_allocate_exception(0x20);
  reason = (char *)std::__cxx11::string::c_str();
  DashelException::DashelException(this_00,InvalidTarget,0,reason,(Stream *)0x0);
  __cxa_throw(this_00,&DashelException::typeinfo,DashelException::~DashelException);
}

Assistant:

T ParameterSet::get(const char* key) const
	{
		T t;
		std::map<std::string, std::string>::const_iterator it = values.find(key);
		if (it == values.end())
		{
			std::string r = std::string("Parameter missing: ").append(key);
			throw Dashel::DashelException(DashelException::InvalidTarget, 0, r.c_str());
		}
		std::istringstream iss(it->second);
		iss >> std::boolalpha >> t;
		return t;
	}